

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void init_builtins(Context_conflict *ctx)

{
  MOJOSHADER_astDataType *dt1;
  MOJOSHADER_astDataType *dt1_00;
  MOJOSHADER_astDataType *dt1_01;
  uint uVar1;
  uint len;
  MOJOSHADER_astDataType *pMVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  MOJOSHADER_astDataType *pMVar6;
  MOJOSHADER_astDataType *pMVar7;
  MOJOSHADER_astDataType *pMVar8;
  MOJOSHADER_astDataType *dt_1;
  uint columns;
  MOJOSHADER_astDataType *dt;
  anon_struct_16_2_7e7b00ca types [6];
  char buf [32];
  
  types[0].str = "bool";
  types[0].datatype = &ctx->dt_bool;
  types[1].str = "int";
  pMVar8 = &ctx->dt_int;
  types[1].datatype = pMVar8;
  types[2].str = "uint";
  pMVar7 = &ctx->dt_uint;
  types[2].datatype = pMVar7;
  types[3].str = "half";
  dt1 = &ctx->dt_half;
  types[3].datatype = dt1;
  types[4].str = "float";
  dt1_00 = &ctx->dt_float;
  types[4].datatype = dt1_00;
  types[5].str = "double";
  dt1_01 = &ctx->dt_double;
  types[5].datatype = dt1_01;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    pMVar6 = types[lVar4].datatype;
    for (columns = 1; columns != 5; columns = columns + 1) {
      pMVar2 = new_datatype_vector(ctx,pMVar6,columns);
      pcVar5 = types[lVar4].str;
      uVar1 = snprintf(buf,0x20,"%s%d",pcVar5,(ulong)columns);
      pcVar3 = stringcache_len(ctx->strcache,buf,uVar1);
      push_usertype(ctx,pcVar3,pMVar2);
      for (uVar1 = 1; uVar1 != 5; uVar1 = uVar1 + 1) {
        pMVar2 = new_datatype_matrix(ctx,pMVar6,columns,uVar1);
        len = snprintf(buf,0x20,"%s%dx%d",pcVar5,(ulong)columns,(ulong)uVar1);
        pcVar3 = stringcache_len(ctx->strcache,buf,len);
        push_usertype(ctx,pcVar3,pMVar2);
      }
    }
  }
  pcVar5 = stringcache(ctx->strcache,"abs");
  add_intrinsic1(ctx,pcVar5,pMVar7,pMVar7);
  pMVar6 = get_usertype(ctx,"uint1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint1x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint1x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint1x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint1x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint2x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint2x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint2x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint2x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint3x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint3x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint3x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint3x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint4x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint4x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint4x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"uint4x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar6 = get_usertype(ctx,"int1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int1x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int1x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int1x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int1x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int2x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int2x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int2x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int2x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int3x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int3x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int3x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int3x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int4x1");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int4x2");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int4x3");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  pMVar6 = get_usertype(ctx,"int4x4");
  add_intrinsic1(ctx,pcVar5,pMVar6,pMVar6);
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"acos");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"all");
  add_intrinsic_BOOL_ANYfib(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"any");
  add_intrinsic_BOOL_ANYfib(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"asin");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"atan");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"atan2");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"ceil");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"clamp");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint1");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint2");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint3");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint4");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint1x1");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint1x2");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint1x3");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint1x4");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint2x1");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint2x2");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint2x3");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint2x4");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint3x1");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint3x2");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint3x3");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint3x4");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint4x1");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint4x2");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint4x3");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  pMVar7 = get_usertype(ctx,"uint4x4");
  add_intrinsic3(ctx,pcVar5,pMVar7,pMVar7,pMVar7,pMVar7);
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"clip");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1_01);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1_00);
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x1");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x2");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x3");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x4");
  add_intrinsic1(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"cos");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"cosh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"cross");
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,pcVar5,pMVar8,pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"D3DCOLORtoUBYTE4");
  pMVar8 = get_usertype(ctx,"int4");
  pMVar7 = get_usertype(ctx,"float4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar7);
  pcVar5 = stringcache(ctx->strcache,"distance");
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"degrees");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"determinant");
  pMVar8 = get_usertype(ctx,"float1x1");
  add_intrinsic1(ctx,pcVar5,dt1_00,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x2");
  add_intrinsic1(ctx,pcVar5,dt1_00,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x3");
  add_intrinsic1(ctx,pcVar5,dt1_00,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x4");
  add_intrinsic1(ctx,pcVar5,dt1_00,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"dot");
  pMVar8 = get_usertype(ctx,"int1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic2(ctx,pcVar5,(MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier,
                 pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"exp");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"exp2");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"faceforward");
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"floor");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"fmod");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"frac");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"isfinite");
  add_intrinsic_BOOL_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"isinf");
  add_intrinsic_BOOL_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"isnan");
  add_intrinsic_BOOL_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"ldexp");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"length");
  add_intrinsic_f_Vf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"lerp");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"lit");
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic3(ctx,pcVar5,pMVar8,dt1_00,dt1_00,dt1_00);
  pcVar5 = stringcache(ctx->strcache,"log");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"log10");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"log2");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"max");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"min");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"modf");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"mul");
  add_intrinsic_mul(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"noise");
  add_intrinsic_f_Vf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"normalize");
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"pow");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"radians");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"reflect");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"refract");
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic3(ctx,pcVar5,pMVar8,pMVar8,pMVar8,
                 (MOJOSHADER_astDataType *)((pMVar8->structure).members)->identifier);
  pcVar5 = stringcache(ctx->strcache,"round");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"rsqrt");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"saturate");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"sign");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"sin");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"sincos");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1_01,dt1_01,dt1_01);
  pMVar8 = get_usertype(ctx,"double1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1,dt1,dt1);
  pMVar8 = get_usertype(ctx,"half1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,dt1_00,dt1_00,dt1_00);
  pMVar8 = get_usertype(ctx,"float1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x1");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x2");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x3");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x4");
  add_intrinsic3(ctx,pcVar5,(MOJOSHADER_astDataType *)0x0,pMVar8,pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"sinh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"smoothstep");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"sqrt");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"step");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tan");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tanh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1D");
  pMVar8 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,pcVar5,pMVar8,&ctx->dt_sampler1d,dt1_00);
  pcVar5 = stringcache(ctx->strcache,"tex2D");
  pMVar8 = get_usertype(ctx,"float4");
  pMVar7 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,pcVar5,pMVar8,&ctx->dt_sampler2d,pMVar7);
  pcVar5 = stringcache(ctx->strcache,"tex3D");
  pMVar8 = get_usertype(ctx,"float4");
  pMVar7 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,pcVar5,pMVar8,&ctx->dt_sampler3d,pMVar7);
  pcVar5 = stringcache(ctx->strcache,"texCUBE");
  pMVar8 = get_usertype(ctx,"float4");
  pMVar7 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,pcVar5,pMVar8,&ctx->dt_samplercube,pMVar7);
  pcVar5 = stringcache(ctx->strcache,"transpose");
  pMVar8 = get_usertype(ctx,"bool1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"bool4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"int4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"uint4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"float4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"half4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double1x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double2x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double3x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x1");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x2");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x3");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pMVar8 = get_usertype(ctx,"double4x4");
  add_intrinsic1(ctx,pcVar5,pMVar8,pMVar8);
  pcVar5 = stringcache(ctx->strcache,"trunc");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"ddx");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"ddy");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"frexp");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"fwidth");
  add_intrinsic_SAME1_ANYf(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1D");
  add_intrinsic_4f_s1_f_f_f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1Dbias");
  add_intrinsic_4f_s1_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1Dgrad");
  add_intrinsic_4f_s1_f_f_f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1Dproj");
  add_intrinsic_4f_s1_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex2D");
  add_intrinsic_4f_s2_2f_2f_2f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex2Dbias");
  add_intrinsic_4f_s2_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex2Dgrad");
  add_intrinsic_4f_s2_2f_2f_2f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex2Dproj");
  add_intrinsic_4f_s2_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex3D");
  add_intrinsic_4f_s3_3f_3f_3f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex3Dbias");
  add_intrinsic_4f_s3_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex3Dgrad");
  add_intrinsic_4f_s3_3f_3f_3f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex3Dproj");
  add_intrinsic_4f_s3_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"texCUBE");
  add_intrinsic_4f_sc_3f_3f_3f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"texCUBEbias");
  add_intrinsic_4f_sc_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"texCUBEgrad");
  add_intrinsic_4f_sc_3f_3f_3f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"texCUBEproj");
  add_intrinsic_4f_sc_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex1Dlod");
  add_intrinsic_4f_s1_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex2Dlod");
  add_intrinsic_4f_s2_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"tex3Dlod");
  add_intrinsic_4f_s3_4f(ctx,pcVar5);
  pcVar5 = stringcache(ctx->strcache,"texCUBElod");
  add_intrinsic_4f_sc_4f(ctx,pcVar5);
  return;
}

Assistant:

static void init_builtins(Context *ctx)
{
    // add in standard typedefs...
    const struct
    {
        const char *str;
        const MOJOSHADER_astDataType *datatype;
    } types[] = {
        { "bool", &ctx->dt_bool },
        { "int", &ctx->dt_int },
        { "uint", &ctx->dt_uint },
        { "half", &ctx->dt_half },
        { "float", &ctx->dt_float },
        { "double", &ctx->dt_double },
    };

    int i, j, k;
    for (i = 0; i < STATICARRAYLEN(types); i++)
    {
        char buf[32];
        int len;
        const MOJOSHADER_astDataType *dt;

        for (j = 1; j <= 4; j++)
        {
            // "float2"
            dt = new_datatype_vector(ctx, types[i].datatype, j);
            len = snprintf(buf, sizeof (buf), "%s%d", types[i].str, j);
            push_usertype(ctx, stringcache_len(ctx->strcache, buf, len), dt);
            for (k = 1; k <= 4; k++)
            {
                // "float2x2"
                dt = new_datatype_matrix(ctx, types[i].datatype, j, k);
                len = snprintf(buf, sizeof (buf), "%s%dx%d", types[i].str,j,k);
                push_usertype(ctx, stringcache_len(ctx->strcache,buf,len), dt);
            } // for
        } // for
    } // for

    // !!! FIXME: block these out by pixel/vertex/etc shader.
    // !!! FIXME: calculate actual shader model (or maybe just let bytecode verifier throw up?).
    const int shader_model = 3;
    if (shader_model >= 1)
    {
        add_intrinsic_SAME1_ANYfi(ctx, stringcache(ctx->strcache, "abs"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "acos"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "all"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "any"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "asin"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "atan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "atan2"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ceil"));
        add_intrinsic_SAME1_ANYfi_SAME1_SAME1(ctx, stringcache(ctx->strcache, "clamp"));
        add_intrinsic_VOID_ANYf(ctx, stringcache(ctx->strcache, "clip"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cos"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cosh"));
        add_intrinsic_3f_3f_3f(ctx, stringcache(ctx->strcache, "cross"));
        add_intrinsic_4i_4f(ctx, stringcache(ctx->strcache, "D3DCOLORtoUBYTE4"));
        add_intrinsic_f_Vf_SAME1(ctx, stringcache(ctx->strcache, "distance"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "degrees"));
        add_intrinsic_f_SQUAREMATRIXf(ctx, stringcache(ctx->strcache, "determinant"));
        add_intrinsic_fi_Vfi_SAME1(ctx, stringcache(ctx->strcache, "dot"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp2"));
        add_intrinsic_SAME1_Vf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "faceforward"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "floor"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "fmod"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "frac"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isfinite"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isinf"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isnan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "ldexp"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "length"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "lerp"));
        add_intrinsic_4f_f_f_f(ctx, stringcache(ctx->strcache, "lit"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log10"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log2"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "max"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "min"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "modf"));  // !!! FIXME: out var?
        add_intrinsic_mul(ctx, stringcache(ctx->strcache, "mul"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "noise"));
        add_intrinsic_SAME1_Vf(ctx, stringcache(ctx->strcache, "normalize"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "pow"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "radians"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "reflect"));
        add_intrinsic_SAME1_Vf_SAME1_f(ctx, stringcache(ctx->strcache, "refract"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "round"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "rsqrt"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "saturate"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sign"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sin"));
        add_intrinsic_VOID_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "sincos"));  // !!! FIXME: out var?
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sinh"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "smoothstep"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sqrt"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "step"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tan"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tanh"));
        add_intrinsic_4f_s1_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s2_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s3_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_sc_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_SAME1_Mfib(ctx, stringcache(ctx->strcache, "transpose"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "trunc"));
    } // if

    if (shader_model >= 2)
    {
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddx"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddy"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "frexp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "fwidth"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dbias"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1Dgrad"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dproj"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dbias"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2Dgrad"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dproj"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dbias"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3Dgrad"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dproj"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEbias"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBEgrad"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEproj"));
    } // if

    if (shader_model >= 3)
    {
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dlod"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dlod"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dlod"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBElod"));
    } // if
}